

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O0

int av1_palette_color_cost_y(PALETTE_MODE_INFO *pmi,uint16_t *color_cache,int n_cache,int bit_depth)

{
  int iVar1;
  undefined4 in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  uint16_t *in_RDI;
  int unaff_retaddr;
  int total_bits;
  int n_out_cache;
  uint8_t cache_color_found [16];
  int out_cache_colors [8];
  int n;
  undefined4 in_stack_ffffffffffffffe0;
  
  av1_index_color_cache
            (_total_bits,unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),
             (uint8_t *)CONCAT44(in_EDX,in_ECX),
             (int *)(ulong)CONCAT14((char)in_RDI[0x18],in_stack_ffffffffffffffe0));
  iVar1 = delta_encode_cost((int *)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX);
  return (in_EDX + iVar1) * 0x200;
}

Assistant:

int av1_palette_color_cost_y(const PALETTE_MODE_INFO *const pmi,
                             const uint16_t *color_cache, int n_cache,
                             int bit_depth) {
  const int n = pmi->palette_size[0];
  int out_cache_colors[PALETTE_MAX_SIZE];
  uint8_t cache_color_found[2 * PALETTE_MAX_SIZE];
  const int n_out_cache =
      av1_index_color_cache(color_cache, n_cache, pmi->palette_colors, n,
                            cache_color_found, out_cache_colors);
  const int total_bits =
      n_cache + delta_encode_cost(out_cache_colors, n_out_cache, bit_depth, 1);
  return av1_cost_literal(total_bits);
}